

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall
Node::OutputDefinitionList(Node *this,ostream *os,Node *MainType,int ExtType,int GlobalStat)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  VARTYPE Type;
  ostream *poVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int iVar4;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  long lVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  char cVar9;
  string local_80;
  int local_60;
  int local_5c;
  string local_58;
  Node *local_38;
  
  local_60 = GlobalStat;
  local_5c = ExtType;
  local_38 = MainType;
  while (iVar7 = this->Type, iVar7 == 0x124) {
    OutputDefinitionList(this->Tree[0],os,local_38,local_5c,local_60);
    this = this->Block[0];
    if (this == (Node *)0x0) {
      return;
    }
  }
  if (iVar7 < 0x1d8) {
    if (iVar7 == 0x112) {
      paVar1 = &local_80.field_2;
      cVar9 = '\0';
      do {
        cVar6 = (char)Level;
        if (Level < 1) {
          cVar6 = cVar9;
        }
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_80,cVar6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"struct",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        poVar3 = (ostream *)std::ostream::flush();
        cVar6 = (char)Level;
        if (Level < 1) {
          cVar6 = cVar9;
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_58,cVar6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        Level = Level + 1;
        OutputDefinitionList(this->Block[1],os,local_38,local_5c,local_60);
        Level = Level + -1;
        cVar6 = (char)Level;
        if (Level < 1) {
          cVar6 = cVar9;
        }
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_80,cVar6);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        this = this->Block[0];
      } while (this != (Node *)0x0);
      return;
    }
    if (iVar7 == 0x18a) {
      iVar7 = 0;
      if (0 < Level) {
        iVar7 = Level;
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_80,(char)iVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      OutputRemark(this,os);
      goto LAB_001198f5;
    }
    if (iVar7 == 0x1b4) {
      iVar7 = 0;
      if (0 < Level) {
        iVar7 = Level;
      }
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_80,(char)iVar7);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"union",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      iVar7 = 0;
      if (0 < Level) {
        iVar7 = Level;
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_58,(char)iVar7);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      Level = Level + 1;
      OutputDefinitionList(this->Block[1],os,local_38,local_5c,local_60);
      Level = Level + -1;
      iVar7 = 0;
      if (0 < Level) {
        iVar7 = Level;
      }
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_80,(char)iVar7);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      goto LAB_00119612;
    }
LAB_00119554:
    iVar7 = 0;
    if (0 < Level) {
      iVar7 = Level;
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)iVar7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_80._M_dataplus._M_p,local_80._M_string_length);
    OutputDefinition_abi_cxx11_(&local_58,this,local_38,local_5c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
LAB_00119612:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return;
    }
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    return;
  }
  if (iVar7 - 0x1fdU < 2) {
LAB_001191a5:
    iVar7 = 0;
    if (0 < Level) {
      iVar7 = Level;
    }
    paVar1 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)iVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_80._M_dataplus._M_p,local_80._M_string_length);
    iVar7 = local_60;
    iVar4 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      iVar4 = extraout_EDX_00;
    }
    if (iVar7 == 2) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"extern ",7);
      iVar4 = extraout_EDX_01;
    }
    if (this->Tree[1] != (Node *)0x0) {
      OutputNodeVarType_abi_cxx11_(&local_80,this->Tree[1]);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      iVar4 = extraout_EDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        iVar4 = extraout_EDX_03;
      }
    }
    if (this->Tree[3] != (Node *)0x0) {
      OutputPassmech_abi_cxx11_(&local_80,this->Tree[3],iVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    OutputVarName_abi_cxx11_(&local_80,this->Tree[0],this->Tree[2],1);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (this->Tree[4] != (Node *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
      OutputCodeOne(this->Tree[4],os);
    }
  }
  else {
    if (iVar7 != 0x1d8) {
      if (iVar7 != 0x1d9) goto LAB_00119554;
      goto LAB_001191a5;
    }
    iVar7 = 0;
    if (0 < Level) {
      iVar7 = Level;
    }
    paVar1 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)iVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_80._M_dataplus._M_p,local_80._M_string_length);
    iVar7 = local_60;
    iVar4 = extraout_EDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      iVar4 = extraout_EDX_05;
    }
    if (iVar7 == 1) {
      pcVar8 = "const ";
      lVar5 = 6;
LAB_001196be:
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar8,lVar5);
      iVar4 = extraout_EDX_06;
    }
    else {
      if (iVar7 == 3) {
        pcVar8 = "extern const ";
        lVar5 = 0xd;
        goto LAB_001196be;
      }
      if (iVar7 == 4) {
        pcVar8 = "extern ";
        lVar5 = 7;
        goto LAB_001196be;
      }
    }
    if (this->Tree[2] == (Node *)0x0) {
      if (this->Tree[1] != (Node *)0x0) {
        OutputNodeVarType_abi_cxx11_(&local_80,this->Tree[1]);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        iVar4 = extraout_EDX_07;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          iVar4 = extraout_EDX_08;
        }
      }
      if (this->Tree[3] != (Node *)0x0) {
        OutputPassmech_abi_cxx11_(&local_80,this->Tree[3],iVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_80._M_dataplus._M_p,local_80._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->Tree[0] != (Node *)0x0) {
        OutputVarName_abi_cxx11_(&local_80,this->Tree[0],this->Tree[2],1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_80._M_dataplus._M_p,local_80._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->Tree[4] == (Node *)0x0) {
        pNVar2 = this->Tree[2];
        Type = GetNodeVarType(this->Tree[1]);
        OutputVarInit_abi_cxx11_(&local_80,(uint)(pNVar2 != (Node *)0x0),Type);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
        Expression_abi_cxx11_(&local_80,this->Tree[4]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      }
    }
    else {
      OutputArrayDef_abi_cxx11_(&local_80,this->Tree[2],this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      OutputVarName_abi_cxx11_(&local_58,this->Tree[0],this->Tree[2],3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
LAB_001198f5:
  if (this->Block[0] == (Node *)0x0) {
    return;
  }
  OutputDefinitionList(this->Block[0],os,local_38,local_5c,local_60);
  return;
}

Assistant:

void Node::OutputDefinitionList(
	std::ostream& os,	/**< iostream to write C++ code to */
	Node* MainType,		/**< main data type */
	int ExtType,		/**< extended data type */
	int GlobalStat		/**< global status */
)
{
	switch(Type)
	{
	case BAS_S_DECLARE:
		Tree[0]->OutputDefinitionList(os,
			MainType, ExtType, GlobalStat);
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os,
				MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEVAR:
		os << Indent();

		switch(GlobalStat)
		{
		case 1:		// Constant definition
			os << "const ";
			break;

		case 3:		// External constant
			os << "extern const ";
			break;

		case 4:		// External
			os << "extern ";
			break;
		}

		//
		// We have an array
		//
		if (Tree[2] != 0)
		{
			os << Tree[2]->OutputArrayDef(this) << " " <<
				Tree[0]->OutputVarName(Tree[2], 1 + 2);
		}
		else
		{
			if (Tree[1] != 0)
			{
				os << Tree[1]->OutputNodeVarType() << " ";
			}
			if (Tree[3] != 0)
			{
				os << Tree[3]->OutputPassmech(0);
			}
			if (Tree[0] != 0)
			{
				os << Tree[0]->OutputVarName(Tree[2], 1);
			}
			if (Tree[4] != 0)
			{
				os << " = " << Tree[4]->Expression();
			}
			else
			{
				os << OutputVarInit(
					Tree[2] != 0,
					Tree[1]->GetNodeVarType());
			}
		}

		os << ";" << std::endl;

//
// For these definitions, a downlink points to the next variable 
// not to internal structures of this variable.
// So, is this needed by anything?
// 
// This is apparently used by DIM statements when multu=iplw variables
// are dimensioned.
//
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEFUN:
	case BAS_N_EXTERNALFUNCTION:
	case BAS_N_EXTERNALSUB:
		os << Indent();

		switch(GlobalStat)
		{
		case 2:		// Constant definition
			os << "extern ";
			break;
		}

		if (Tree[1] != 0)
		{
			os << Tree[1]->OutputNodeVarType() << " ";
		}
		if (Tree[3] != 0)
		{
			os << Tree[3]->OutputPassmech(1);
		}
		os << Tree[0]->OutputVarName(Tree[2], 1);
		if (Tree[4] != 0)
		{
			os << " = ";
			Tree[4]->OutputCodeOne(os);
		}
		os << ";" << std::endl;
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_S_VARIANT:

		os << Indent() << "union" << std::endl <<
			Indent() << "{" << std::endl;
		Level++;
		Block[1]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		Level--;
		os << Indent() << "};" << std::endl;

		break;

	case BAS_S_CASE:
		//
		// Variant case
		//
		for (Node* loop = this; loop != 0; loop = loop->Block[0])
		{
			os << Indent() << "struct" << std::endl <<
				Indent() << "{" << std::endl;
			Level++;
			loop->Block[1]->OutputDefinitionList(os, MainType, ExtType,
				GlobalStat);
			Level--;
			os << Indent() << "};" << std::endl;
		}

		break;


	case BAS_S_REMARK:
		os << Indent();
		OutputRemark(os);
		if (Block[0] != 0)
		{
			Block[0]->OutputDefinitionList(os, MainType, ExtType, GlobalStat);
		}
		break;

	default:
		os << Indent() << OutputDefinition(MainType, ExtType) << ";" << std::endl;
		break;
	}
}